

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::ProcessEHRegionBoundary(LinearScan *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *ppLVar4;
  Instr *local_50;
  Instr *insertionInstr;
  Lifetime **lifetime;
  EditingIterator iter;
  Instr *instr_local;
  LinearScan *this_local;
  
  iter.super_EditingIterator.last = (NodeBase *)instr;
  bVar2 = IR::Instr::IsBranchInstr(instr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xba1,"(instr->IsBranchInstr())","instr->IsBranchInstr()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (((*(short *)&iter.super_EditingIterator.last[6].next == 0xe7) ||
      (*(short *)&iter.super_EditingIterator.last[6].next == 0xe8)) ||
     (*(short *)&iter.super_EditingIterator.last[6].next == 0xeb)) {
    SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
              ((EditingIterator *)&lifetime,this->activeLiveranges);
    while (bVar2 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                             ((EditingIterator *)&lifetime), bVar2) {
      ppLVar4 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&lifetime);
      if (*(short *)&iter.super_EditingIterator.last[6].next == 0xeb) {
        local_50 = (Instr *)iter.super_EditingIterator.last[3].next;
      }
      else {
        local_50 = (Instr *)iter.super_EditingIterator.last;
      }
      BVUnitT<unsigned_long>::Clear(&this->activeRegs,(uint)(*ppLVar4)->reg);
      bVar2 = Lifetime::IsInt(*ppLVar4);
      if (bVar2) {
        this->intRegUsedCount = this->intRegUsedCount - 1;
      }
      else {
        this->floatRegUsedCount = this->floatRegUsedCount - 1;
      }
      SpillLiveRange(this,*ppLVar4,local_50);
      SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
                ((EditingIterator *)&lifetime);
    }
  }
  return;
}

Assistant:

void
LinearScan::ProcessEHRegionBoundary(IR::Instr * instr)
{
    Assert(instr->IsBranchInstr());

    if (instr->m_opcode != Js::OpCode::TryCatch && instr->m_opcode != Js::OpCode::TryFinally && instr->m_opcode != Js::OpCode::Leave)
    {
        return;
    }

    // Spill everything upon entry to the try region and upon a Leave.
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, lifetime, this->activeLiveranges, iter)
    {
        IR::Instr* insertionInstr = instr->m_opcode != Js::OpCode::Leave ? instr : instr->m_prev;
        this->activeRegs.Clear(lifetime->reg);
        if (lifetime->IsInt())
        {
            this->intRegUsedCount--;
        }
        else
        {
            this->floatRegUsedCount--;
        }
        this->SpillLiveRange(lifetime, insertionInstr);
        iter.RemoveCurrent();
    }
    NEXT_SLIST_ENTRY_EDITING;
}